

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_print.c
# Opt level: O0

int fmtfp(char **sbuffer,char **buffer,size_t *currlen,size_t *maxlen,double fvalue,int min,int max,
         int flags,int style)

{
  char **buffer_00;
  char **sbuffer_00;
  int iVar1;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  uint in_stack_00000008;
  int in_stack_00000010;
  char ech;
  int tmpexp;
  int realstyle;
  unsigned_long max10;
  unsigned_long fracpart;
  unsigned_long intpart;
  long exp;
  int zpadlen;
  int padlen;
  int eplace;
  int fplace;
  int iplace;
  char econvert [20];
  char fconvert [20];
  char iconvert [20];
  double tmpvalue;
  double ufvalue;
  int signvalue;
  bool local_fa;
  bool local_f9;
  double in_stack_ffffffffffffff08;
  int c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  uint in_stack_ffffffffffffff18;
  int iVar4;
  char **in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff28;
  ulong local_d0;
  long local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  char acStack_a8 [32];
  char acStack_88 [32];
  char acStack_68 [24];
  double local_50;
  double local_48;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  
  c = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_3c = 0;
  local_ac = 0;
  local_b0 = 0;
  local_b4 = 0;
  local_c8 = 0;
  local_38 = in_R9D;
  if (in_R9D < 0) {
    local_38 = 6;
  }
  if (0.0 <= in_XMM0_Qa) {
    if ((in_stack_00000008 & 2) == 0) {
      if ((in_stack_00000008 & 4) != 0) {
        local_3c = 0x20;
      }
    }
    else {
      local_3c = 0x2b;
    }
  }
  else {
    local_3c = 0x2d;
  }
  iVar4 = in_stack_00000010;
  local_34 = in_R8D;
  local_30 = in_XMM0_Qa;
  if (in_stack_00000010 == 2) {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      if (0.0001 <= in_XMM0_Qa) {
        if (((local_38 == 0) && (10.0 <= in_XMM0_Qa)) ||
           ((0 < local_38 &&
            (dVar2 = pow_10(local_38), in_stack_ffffffffffffff08 = in_XMM0_Qa, dVar2 <= in_XMM0_Qa))
           )) {
          c = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          iVar4 = 1;
        }
        else {
          c = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          iVar4 = 0;
        }
      }
      else {
        iVar4 = 1;
      }
    }
    else {
      iVar4 = 0;
    }
  }
  if (in_stack_00000010 != 0) {
    local_50 = local_30;
    if ((local_30 != 0.0) || (NAN(local_30))) {
      for (; local_50 < 1.0; local_50 = local_50 * 10.0) {
        local_c8 = local_c8 + -1;
      }
      for (; 10.0 < local_50; local_50 = local_50 / 10.0) {
        local_c8 = local_c8 + 1;
      }
    }
    if (in_stack_00000010 == 2) {
      if (local_38 == 0) {
        local_38 = 1;
      }
      if (iVar4 == 0) {
        local_38 = local_38 - ((int)local_c8 + 1);
        if (local_38 < 0) {
          doapr_outch(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                      (size_t *)(ulong)in_stack_ffffffffffffff18,
                      (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
          return 0;
        }
      }
      else {
        local_38 = local_38 + -1;
      }
    }
    if (iVar4 == 1) {
      local_30 = local_50;
    }
  }
  local_48 = abs_val(local_30);
  if (1.8446744073709552e+19 <= local_48) {
    doapr_outch(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                (size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
    return 0;
  }
  local_d0 = (long)local_48 | (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f;
  if (9 < local_38) {
    local_38 = 9;
  }
  dVar2 = pow_10(local_38);
  buffer_00 = (char **)roundv(dVar2);
  dVar2 = pow_10(local_38);
  auVar3._8_4_ = (int)(local_d0 >> 0x20);
  auVar3._0_8_ = local_d0;
  auVar3._12_4_ = 0x45300000;
  sbuffer_00 = (char **)roundv(dVar2 * (local_48 -
                                       ((auVar3._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)local_d0) -
                                       4503599627370496.0))));
  iVar1 = local_ac;
  if (buffer_00 <= sbuffer_00) {
    local_d0 = local_d0 + 1;
    sbuffer_00 = (char **)((long)sbuffer_00 - (long)buffer_00);
  }
  do {
    local_ac = iVar1;
    iVar1 = local_ac + 1;
    acStack_68[local_ac] = "0123456789"[local_d0 % 10];
    local_d0 = local_d0 / 10;
    local_f9 = local_d0 != 0 && iVar1 < 0x14;
  } while (local_f9);
  if (iVar1 == 0x14) {
    iVar1 = local_ac;
  }
  local_ac = iVar1;
  acStack_68[local_ac] = '\0';
  do {
    while( true ) {
      if (local_38 <= local_b0) goto LAB_003905cf;
      if (((in_stack_00000010 == 2) && (local_b0 == 0)) && ((ulong)sbuffer_00 % 10 == 0)) break;
      acStack_88[local_b0] = "0123456789"[(ulong)sbuffer_00 % 10];
      sbuffer_00 = (char **)((ulong)sbuffer_00 / 10);
      local_b0 = local_b0 + 1;
    }
    local_38 = local_38 + -1;
    sbuffer_00 = (char **)((ulong)sbuffer_00 / 10);
  } while (0 < local_38);
LAB_003905cf:
  if (local_b0 == 0x14) {
    local_b0 = 0x13;
  }
  acStack_88[local_b0] = '\0';
  iVar1 = local_b4;
  if (iVar4 == 1) {
    in_stack_ffffffffffffff18 = (uint)local_c8;
    if (local_c8 < 0) {
      in_stack_ffffffffffffff18 = -in_stack_ffffffffffffff18;
    }
    do {
      local_b4 = iVar1;
      iVar1 = local_b4 + 1;
      acStack_a8[local_b4] = "0123456789"[(int)in_stack_ffffffffffffff18 % 10];
      in_stack_ffffffffffffff18 = (int)in_stack_ffffffffffffff18 / 10;
      local_fa = 0 < (int)in_stack_ffffffffffffff18 && iVar1 < 0x14;
    } while (local_fa);
    if (0 < (int)in_stack_ffffffffffffff18) {
      doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(1,in_stack_ffffffffffffff18),
                  (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
      return 0;
    }
    if (iVar1 == 1) {
      acStack_a8[1] = 0x30;
      iVar1 = local_b4 + 2;
    }
  }
  local_b4 = iVar1;
  local_b8 = (((local_34 - local_ac) - local_38) - (uint)(0 < local_38)) - (uint)(local_3c != 0);
  if (iVar4 == 1) {
    local_b8 = local_b8 - (local_b4 + 2);
  }
  local_bc = local_38 - local_b0;
  if (local_bc < 0) {
    local_bc = 0;
  }
  if (local_b8 < 0) {
    local_b8 = 0;
  }
  if ((in_stack_00000008 & 1) != 0) {
    local_b8 = -local_b8;
  }
  if (((in_stack_00000008 & 0x10) != 0) && (0 < local_b8)) {
    if (local_3c != 0) {
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) {
        return 0;
      }
      local_b8 = local_b8 + -1;
      local_3c = 0;
    }
    for (; 0 < local_b8; local_b8 = local_b8 + -1) {
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  for (; 0 < local_b8; local_b8 = local_b8 + -1) {
    iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                        (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((local_3c != 0) &&
     (iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
     , iVar1 == 0)) {
    return 0;
  }
  while (0 < local_ac) {
    local_ac = local_ac + -1;
    iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                        (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((0 < local_38) || ((in_stack_00000008 & 8) != 0)) {
    iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                        (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
    if (iVar1 == 0) {
      return 0;
    }
    while (0 < local_b0) {
      local_b0 = local_b0 + -1;
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  for (; 0 < local_bc; local_bc = local_bc + -1) {
    iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                        (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (iVar4 != 1) {
LAB_00390ba6:
    while( true ) {
      if (-1 < local_b8) {
        return 1;
      }
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) break;
      local_b8 = local_b8 + 1;
    }
    return 0;
  }
  if ((in_stack_00000008 & 0x20) == 0) {
    in_stack_ffffffffffffff17 = 0x65;
  }
  else {
    in_stack_ffffffffffffff17 = 0x45;
  }
  iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(1,in_stack_ffffffffffffff18),
                      (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c);
  if (iVar1 != 0) {
    if (local_c8 < 0) {
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
      if (iVar1 == 0) {
        return 0;
      }
    }
    do {
      if (local_b4 < 1) goto LAB_00390ba6;
      local_b4 = local_b4 + -1;
      iVar1 = doapr_outch(sbuffer_00,buffer_00,(size_t *)CONCAT44(iVar4,in_stack_ffffffffffffff18),
                          (size_t *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),c)
      ;
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

static int
fmtfp(char **sbuffer,
      char **buffer,
      size_t *currlen,
      size_t *maxlen, LDOUBLE fvalue, int min, int max, int flags, int style)
{
    int signvalue = 0;
    LDOUBLE ufvalue;
    LDOUBLE tmpvalue;
    char iconvert[20];
    char fconvert[20];
    char econvert[20];
    int iplace = 0;
    int fplace = 0;
    int eplace = 0;
    int padlen = 0;
    int zpadlen = 0;
    long exp = 0;
    unsigned long intpart;
    unsigned long fracpart;
    unsigned long max10;
    int realstyle;

    if (max < 0)
        max = 6;

    if (fvalue < 0)
        signvalue = '-';
    else if (flags & DP_F_PLUS)
        signvalue = '+';
    else if (flags & DP_F_SPACE)
        signvalue = ' ';

    /*
     * G_FORMAT sometimes prints like E_FORMAT and sometimes like F_FORMAT
     * depending on the number to be printed. Work out which one it is and use
     * that from here on.
     */
    if (style == G_FORMAT) {
        if (fvalue == 0.0) {
            realstyle = F_FORMAT;
        } else if (fvalue < 0.0001) {
            realstyle = E_FORMAT;
        } else if ((max == 0 && fvalue >= 10)
                    || (max > 0 && fvalue >= pow_10(max))) {
            realstyle = E_FORMAT;
        } else {
            realstyle = F_FORMAT;
        }
    } else {
        realstyle = style;
    }

    if (style != F_FORMAT) {
        tmpvalue = fvalue;
        /* Calculate the exponent */
        if (fvalue != 0.0) {
            while (tmpvalue < 1) {
                tmpvalue *= 10;
                exp--;
            }
            while (tmpvalue > 10) {
                tmpvalue /= 10;
                exp++;
            }
        }
        if (style == G_FORMAT) {
            /*
             * In G_FORMAT the "precision" represents significant digits. We
             * always have at least 1 significant digit.
             */
            if (max == 0)
                max = 1;
            /* Now convert significant digits to decimal places */
            if (realstyle == F_FORMAT) {
                max -= (exp + 1);
                if (max < 0) {
                    /*
                     * Should not happen. If we're in F_FORMAT then exp < max?
                     */
                    (void)doapr_outch(sbuffer, buffer, currlen, maxlen, '\0');
                    return 0;
                }
            } else {
                /*
                 * In E_FORMAT there is always one significant digit in front
                 * of the decimal point, so:
                 * significant digits == 1 + decimal places
                 */
                max--;
            }
        }
        if (realstyle == E_FORMAT)
            fvalue = tmpvalue;
    }
    ufvalue = abs_val(fvalue);
    /*
     * By subtracting 65535 (2^16-1) we cancel the low order 15 bits
     * of ULONG_MAX to avoid using imprecise floating point values.
     */
    if (ufvalue >= (double)(ULONG_MAX - 65535) + 65536.0) {
        /* Number too big */
        (void)doapr_outch(sbuffer, buffer, currlen, maxlen, '\0');
        return 0;
    }
    intpart = (unsigned long)ufvalue;

    /*
     * sorry, we only support 9 digits past the decimal because of our
     * conversion method
     */
    if (max > 9)
        max = 9;

    /*
     * we "cheat" by converting the fractional part to integer by multiplying
     * by a factor of 10
     */
    max10 = roundv(pow_10(max));
    fracpart = roundv(pow_10(max) * (ufvalue - intpart));

    if (fracpart >= max10) {
        intpart++;
        fracpart -= max10;
    }

    /* convert integer part */
    do {
        iconvert[iplace++] = "0123456789"[intpart % 10];
        intpart = (intpart / 10);
    } while (intpart && (iplace < (int)sizeof(iconvert)));
    if (iplace == sizeof(iconvert))
        iplace--;
    iconvert[iplace] = 0;

    /* convert fractional part */
    while (fplace < max) {
        if (style == G_FORMAT && fplace == 0 && (fracpart % 10) == 0) {
            /* We strip trailing zeros in G_FORMAT */
            max--;
            fracpart = fracpart / 10;
            if (fplace < max)
                continue;
            break;
        }
        fconvert[fplace++] = "0123456789"[fracpart % 10];
        fracpart = (fracpart / 10);
    }

    if (fplace == sizeof(fconvert))
        fplace--;
    fconvert[fplace] = 0;

    /* convert exponent part */
    if (realstyle == E_FORMAT) {
        int tmpexp;
        if (exp < 0)
            tmpexp = -exp;
        else
            tmpexp = exp;

        do {
            econvert[eplace++] = "0123456789"[tmpexp % 10];
            tmpexp = (tmpexp / 10);
        } while (tmpexp > 0 && eplace < (int)sizeof(econvert));
        /* Exponent is huge!! Too big to print */
        if (tmpexp > 0) {
            (void)doapr_outch(sbuffer, buffer, currlen, maxlen, '\0');
            return 0;
        }
        /* Add a leading 0 for single digit exponents */
        if (eplace == 1)
            econvert[eplace++] = '0';
    }

    /*
     * -1 for decimal point (if we have one, i.e. max > 0),
     * another -1 if we are printing a sign
     */
    padlen = min - iplace - max - (max > 0 ? 1 : 0) - ((signvalue) ? 1 : 0);
    /* Take some off for exponent prefix "+e" and exponent */
    if (realstyle == E_FORMAT)
        padlen -= 2 + eplace;
    zpadlen = max - fplace;
    if (zpadlen < 0)
        zpadlen = 0;
    if (padlen < 0)
        padlen = 0;
    if (flags & DP_F_MINUS)
        padlen = -padlen;

    if ((flags & DP_F_ZERO) && (padlen > 0)) {
        if (signvalue) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen, signvalue))
                return 0;
            --padlen;
            signvalue = 0;
        }
        while (padlen > 0) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '0'))
                return 0;
            --padlen;
        }
    }
    while (padlen > 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        --padlen;
    }
    if (signvalue && !doapr_outch(sbuffer, buffer, currlen, maxlen, signvalue))
        return 0;

    while (iplace > 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, iconvert[--iplace]))
            return 0;
    }

    /*
     * Decimal point. This should probably use locale to find the correct
     * char to print out.
     */
    if (max > 0 || (flags & DP_F_NUM)) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '.'))
            return 0;

        while (fplace > 0) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen,
                             fconvert[--fplace]))
                return 0;
        }
    }
    while (zpadlen > 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '0'))
            return 0;
        --zpadlen;
    }
    if (realstyle == E_FORMAT) {
        char ech;

        if ((flags & DP_F_UP) == 0)
            ech = 'e';
        else
            ech = 'E';
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ech))
                return 0;
        if (exp < 0) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '-'))
                    return 0;
        } else {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen, '+'))
                    return 0;
        }
        while (eplace > 0) {
            if (!doapr_outch(sbuffer, buffer, currlen, maxlen,
                             econvert[--eplace]))
                return 0;
        }
    }

    while (padlen < 0) {
        if (!doapr_outch(sbuffer, buffer, currlen, maxlen, ' '))
            return 0;
        ++padlen;
    }
    return 1;
}